

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TimesBetaPlusZ
          (TPZFMatrix<std::complex<float>_> *this,complex<float> beta,
          TPZFMatrix<std::complex<float>_> *z)

{
  complex<float> *pcVar1;
  undefined8 *puVar2;
  complex<float> *this_00;
  complex<float> local_28;
  
  this_00 = this->fElem;
  pcVar1 = this_00 + (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol *
                     (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  puVar2 = *(undefined8 **)(beta._M_value + 0x20);
  for (; this_00 < pcVar1; this_00 = this_00 + 1) {
    std::complex<float>::operator*=(this_00,&local_28);
    this_00->_M_value =
         CONCAT44((float)(this_00->_M_value >> 0x20) + (float)((ulong)*puVar2 >> 0x20),
                  (float)this_00->_M_value + (float)*puVar2);
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}